

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void __thiscall buffer::reserve(buffer *this,int count)

{
  char *pcVar1;
  int iVar2;
  char *__ptr;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  __ptr = this->buffer_;
  pcVar1 = this->begin_;
  iVar5 = this->capacity_;
  if ((long)(__ptr + ((long)iVar5 - (long)pcVar1)) <= (long)count) {
    uVar6 = (long)this->end_ - (long)pcVar1;
    uVar4 = (long)pcVar1 - (long)__ptr;
    if (count < this->init_size_) {
      count = this->init_size_;
    }
    iVar2 = 0x2000;
    if (0x2000 < iVar5) {
      iVar2 = iVar5;
    }
    do {
      iVar3 = iVar2;
      iVar2 = iVar3 * 2;
    } while (iVar3 < count);
    if (iVar5 < iVar3) {
      __ptr = (char *)realloc(__ptr,(long)iVar3);
      this->buffer_ = __ptr;
      this->capacity_ = iVar3;
    }
    iVar5 = (int)uVar6;
    if ((0 < (int)uVar4) && (0 < iVar5)) {
      memmove(__ptr,__ptr + (uVar4 & 0x7fffffff),uVar6 & 0x7fffffff);
      __ptr = this->buffer_;
    }
    this->begin_ = __ptr;
    this->end_ = __ptr + iVar5;
  }
  return;
}

Assistant:

void buffer::reserve(int count)
{
    if (buffer_ + capacity_ - begin_ > count)
    {
        return;
    }

    int used = end_ - begin_;
    int bias = begin_ - buffer_; 

    count = std::max<int>(count, init_size_);
    int capacity = std::max<int>(min_buffer_size, capacity_);
    while (capacity < count) capacity *= 2;
        
    if (capacity_ < capacity)
    {
        buffer_ = (char*)realloc(buffer_, capacity);
        capacity_ = capacity;
    }

    if (used > 0 && bias > 0)
    {
        memmove(buffer_, buffer_ + bias, used);
    }

    begin_ = buffer_;
    end_ = begin_ + used;
}